

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvkgen.cpp
# Opt level: O0

QByteArray * __thiscall Preamble::get(Preamble *this,QString *fn)

{
  bool bVar1;
  QFlagsStorage<QIODeviceBase::OpenModeFlag> QVar2;
  ulong uVar3;
  char *pcVar4;
  QString *in_RDX;
  QByteArrayView *in_RSI;
  QByteArray *in_RDI;
  long in_FS_OFFSET;
  QByteArrayView QVar5;
  QByteArrayView QVar6;
  QFile f;
  QByteArray *in_stack_ffffffffffffff38;
  QByteArray *data;
  undefined4 in_stack_ffffffffffffff58;
  storage_type *local_88;
  storage_type *local_78;
  qsizetype local_70;
  char local_38 [32];
  undefined8 local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  data = in_RDI;
  bVar1 = QByteArray::isEmpty((QByteArray *)0x105bc7);
  if (bVar1) {
    local_18 = 0xaaaaaaaaaaaaaaaa;
    local_10 = 0xaaaaaaaaaaaaaaaa;
    QFile::QFile((QFile *)&local_18,(QString *)in_RDX);
    QVar2.i = (Int)operator|((enum_type)((ulong)in_RDI >> 0x20),(enum_type)in_RDI);
    uVar3 = QFile::open((QFlags *)&local_18);
    if ((uVar3 & 1) == 0) {
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)in_RSI,(char *)data,(int)((ulong)in_RDI >> 0x20),
                 (char *)in_stack_ffffffffffffff38);
      QtPrivate::asString(in_RDX);
      QString::toLocal8Bit((QString *)CONCAT44(QVar2.i,in_stack_ffffffffffffff58));
      pcVar4 = QByteArray::constData((QByteArray *)0x105c6e);
      QMessageLogger::warning(local_38,"Failed to open %s",pcVar4);
      QByteArray::~QByteArray((QByteArray *)0x105c91);
      QByteArray::QByteArray(in_RDI,in_stack_ffffffffffffff38);
    }
    else {
      QIODevice::readAll();
      QByteArray::operator=(in_RDI,in_stack_ffffffffffffff38);
      QByteArray::~QByteArray((QByteArray *)0x105cd8);
      QByteArrayView::QByteArrayView<4ul>(in_RSI,(char (*) [4])data);
      QByteArrayView::QByteArrayView<6ul>(in_RSI,(char (*) [6])data);
      QVar5.m_data = local_78;
      QVar5.m_size = (qsizetype)in_RSI;
      QVar6.m_data = local_88;
      QVar6.m_size = local_70;
      QByteArray::replace(QVar5,QVar6);
      QByteArray::operator+=(in_RDI,(char *)in_stack_ffffffffffffff38);
      QByteArray::QByteArray(in_RDI,in_stack_ffffffffffffff38);
    }
    QFile::~QFile((QFile *)&local_18);
  }
  else {
    QByteArray::QByteArray(in_RDI,in_stack_ffffffffffffff38);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return data;
  }
  __stack_chk_fail();
}

Assistant:

QByteArray Preamble::get(const QString &fn)
{
    if (!m_str.isEmpty())
        return m_str;

    QFile f(fn);
    if (!f.open(QIODevice::ReadOnly | QIODevice::Text)) {
        qWarning("Failed to open %s", qPrintable(fn));
        return m_str;
    }

    m_str = f.readAll();
    m_str.replace("FOO", "QtGui");
    m_str += "\n// This file is automatically generated by qvkgen. Do not edit.\n";

    return m_str;
}